

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigInd.c
# Opt level: O0

int Saig_ManInduction(Aig_Man_t *p,int nTimeOut,int nFramesMax,int nConfMax,int fUnique,
                     int fUniqueAll,int fGetCex,int fVerbose,int fVeryVerbose)

{
  long lVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  abctime aVar10;
  Vec_Ptr_t *vSupp;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t **ppObjs;
  Aig_Man_t *pAVar12;
  void *pvVar13;
  Aig_Obj_t *pAVar14;
  abctime aVar15;
  Abc_Cex_t *pAVar16;
  undefined4 uVar17;
  uint local_1d4;
  long local_e8;
  Abc_Cex_t *pCex;
  int iBit;
  int VarNum;
  abctime nTimeToStop;
  abctime clk;
  uint local_b8;
  int nClauses;
  int nConstrs;
  int fAdded;
  int iLast;
  int iReg;
  int nOldSize;
  int nConfPrev;
  int nSatVarNum;
  int RetValue;
  int status;
  int Lits [2];
  int f;
  int k;
  int i;
  Aig_Obj_t *pObjPo;
  Aig_Obj_t *pObjPiCopy;
  Aig_Obj_t *pObjPi;
  Vec_Ptr_t *vBot;
  Vec_Ptr_t *vTop;
  Vec_Int_t *vTopVarIds;
  Vec_Int_t *vState;
  Vec_Int_t *vTopVarNums;
  Cnf_Dat_t *pCnfPart;
  Aig_Man_t *pAigPart;
  sat_solver *pSat;
  int local_20;
  int fUniqueAll_local;
  int fUnique_local;
  int nConfMax_local;
  int nFramesMax_local;
  int nTimeOut_local;
  Aig_Man_t *p_local;
  
  pCnfPart = (Cnf_Dat_t *)0x0;
  vTopVarNums = (Vec_Int_t *)0x0;
  vTop = (Vec_Ptr_t *)0x0;
  nSatVarNum = -1;
  local_b8 = 0;
  clk._4_4_ = 0;
  pSat._4_4_ = fUniqueAll;
  local_20 = fUnique;
  fUniqueAll_local = nConfMax;
  fUnique_local = nFramesMax;
  nConfMax_local = nTimeOut;
  _nFramesMax_local = p;
  if (nTimeOut == 0) {
    local_e8 = 0;
  }
  else {
    aVar10 = Abc_Clock();
    local_e8 = (long)nTimeOut * 1000000 + aVar10;
  }
  if ((local_20 != 0) && (pSat._4_4_ != 0)) {
    __assert_fail("fUnique == 0 || fUniqueAll == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                  ,0xa0,"int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  iVar4 = Saig_ManPoNum(_nFramesMax_local);
  if (iVar4 != 1) {
    __assert_fail("Saig_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                  ,0xa1,"int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  Aig_ManSetCioIds(_nFramesMax_local);
  vSupp = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  vTopVarIds = Vec_IntAlloc(1000);
  pAVar11 = Aig_ManCo(_nFramesMax_local,0);
  Vec_PtrPush(p_00,pAVar11);
  vState = Vec_IntAlloc(100);
  pAigPart = (Aig_Man_t *)sat_solver_new();
  sat_solver_setnvars((sat_solver *)pAigPart,1000);
  if (local_e8 != 0) {
    sat_solver_set_runtime_limit((sat_solver *)pAigPart,local_e8);
  }
  nConfPrev = -1;
  nOldSize = 0;
  if (fVerbose != 0) {
    printf("Induction parameters: FramesMax = %5d. ConflictMax = %6d.\n",(ulong)(uint)fUnique_local,
           (ulong)(uint)fUniqueAll_local);
  }
  Lits[0] = 0;
  do {
    if (0 < Lits[0]) {
      Aig_ManStop((Aig_Man_t *)pCnfPart);
      Cnf_DataFree((Cnf_Dat_t *)vTopVarNums);
    }
    aVar10 = Abc_Clock();
    pAVar12 = _nFramesMax_local;
    ppObjs = (Aig_Obj_t **)Vec_PtrArray(p_00);
    iVar4 = Vec_PtrSize(p_00);
    Aig_SupportNodes(pAVar12,ppObjs,iVar4,vSupp);
    pAVar12 = Aig_ManDupSimpleDfsPart(_nFramesMax_local,vSupp,p_00);
    pCnfPart = (Cnf_Dat_t *)pAVar12;
    iVar4 = Aig_ManCoNum(pAVar12);
    vTopVarNums = (Vec_Int_t *)Cnf_Derive(pAVar12,iVar4);
    Cnf_DataLift((Cnf_Dat_t *)vTopVarNums,nOldSize);
    nOldSize = *(int *)&vTopVarNums->pArray + nOldSize;
    clk._4_4_ = vTopVarNums[1].nCap + clk._4_4_;
    if ((fGetCex != 0) && (vTop == (Vec_Ptr_t *)0x0)) {
      iVar4 = Aig_ManCiNum(_nFramesMax_local);
      vTop = (Vec_Ptr_t *)Vec_IntStartFull(iVar4);
      for (f = 0; iVar4 = Vec_PtrSize(_nFramesMax_local->vCis), f < iVar4; f = f + 1) {
        pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(_nFramesMax_local->vCis,f);
        if ((pAVar11->field_5).pData != (void *)0x0) {
          pAVar14 = (Aig_Obj_t *)(pAVar11->field_5).pData;
          iVar4 = Aig_ObjIsCi(pAVar14);
          if (iVar4 == 0) {
            __assert_fail("Aig_ObjIsCi(pObjPiCopy)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0xd3,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          iVar4 = Saig_ObjIsPi(_nFramesMax_local,pAVar11);
          pVVar2 = vTop;
          if (iVar4 == 0) {
            iVar4 = Saig_ObjIsLo(_nFramesMax_local,pAVar11);
            pVVar2 = vTop;
            if (iVar4 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                            ,0xd8,
                            "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                           );
            }
            iVar4 = Aig_ObjCioId(pAVar11);
            iVar6 = Saig_ManPiNum(_nFramesMax_local);
            lVar1 = *(long *)(vTopVarNums + 2);
            iVar5 = Aig_ObjId(pAVar14);
            Vec_IntWriteEntry((Vec_Int_t *)pVVar2,iVar4 - iVar6,*(int *)(lVar1 + (long)iVar5 * 4));
          }
          else {
            iVar4 = Aig_ObjCioId(pAVar11);
            iVar6 = Saig_ManRegNum(_nFramesMax_local);
            lVar1 = *(long *)(vTopVarNums + 2);
            iVar5 = Aig_ObjId(pAVar14);
            Vec_IntWriteEntry((Vec_Int_t *)pVVar2,iVar4 + iVar6,*(int *)(lVar1 + (long)iVar5 * 4));
          }
        }
      }
    }
    iVar4 = Aig_ManCoNum((Aig_Man_t *)pCnfPart);
    iVar6 = Vec_IntSize(vState);
    if (iVar4 + -1 != iVar6) {
      __assert_fail("Aig_ManCoNum(pAigPart)-1 == Vec_IntSize(vTopVarNums)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                    ,0xdd,
                    "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
    }
    for (f = 0; iVar4 = Vec_PtrSize((Vec_Ptr_t *)pCnfPart->pClauses), f < iVar4; f = f + 1) {
      pvVar13 = Vec_PtrEntry((Vec_Ptr_t *)pCnfPart->pClauses,f);
      if (f == 0) {
        RetValue = toLitCond(*(int *)(*(long *)(vTopVarNums + 2) +
                                     (long)*(int *)((long)pvVar13 + 0x24) * 4),(uint)(0 < Lits[0]));
        iVar4 = sat_solver_addclause((sat_solver *)pAigPart,&RetValue,&status);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0xe8,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        clk._4_4_ = clk._4_4_ + 1;
      }
      else {
        iVar4 = Vec_IntEntry(vState,f + -1);
        RetValue = toLitCond(iVar4,0);
        status = toLitCond(*(int *)(*(long *)(vTopVarNums + 2) +
                                   (long)*(int *)((long)pvVar13 + 0x24) * 4),1);
        iVar4 = sat_solver_addclause((sat_solver *)pAigPart,&RetValue,Lits);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0xef,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar4 = Vec_IntEntry(vState,f + -1);
        RetValue = toLitCond(iVar4,1);
        status = toLitCond(*(int *)(*(long *)(vTopVarNums + 2) +
                                   (long)*(int *)((long)pvVar13 + 0x24) * 4),0);
        iVar4 = sat_solver_addclause((sat_solver *)pAigPart,&RetValue,Lits);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0xf3,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        clk._4_4_ = clk._4_4_ + 2;
      }
    }
    f = 0;
    while ((f < vTopVarNums[1].nCap &&
           (iVar4 = sat_solver_addclause
                              ((sat_solver *)pAigPart,*(lit **)(vTopVarNums[1].pArray + (long)f * 2)
                               ,*(lit **)(vTopVarNums[1].pArray + (long)(f + 1) * 2)), iVar4 != 0)))
    {
      f = f + 1;
    }
    if (f < vTopVarNums[1].nCap) {
      nConfPrev = 1;
LAB_008d4620:
      if (fVerbose != 0) {
        if ((local_e8 == 0) || (aVar10 = Abc_Clock(), aVar10 < local_e8)) {
          if (nSatVarNum == 0) {
            printf("Conflict limit (%d) was reached during iteration %d.\n",
                   (ulong)(uint)fUniqueAll_local,(ulong)(Lits[0] + 1));
          }
          else if ((local_20 == 0) && (pSat._4_4_ == 0)) {
            printf("Completed %d iterations.\n",(ulong)(Lits[0] + 1));
          }
          else {
            printf("Completed %d iterations and added %d uniqueness constraints.\n",
                   (ulong)(Lits[0] + 1),(ulong)local_b8);
          }
        }
        else {
          printf("Timeout (%d sec) was reached during iteration %d.\n",(ulong)(uint)nConfMax_local,
                 (ulong)(Lits[0] + 1));
        }
      }
      sat_solver_delete((sat_solver *)pAigPart);
      Aig_ManStop((Aig_Man_t *)pCnfPart);
      Cnf_DataFree((Cnf_Dat_t *)vTopVarNums);
      Vec_IntFree(vState);
      Vec_PtrFree(p_00);
      Vec_PtrFree(vSupp);
      Vec_IntFree(vTopVarIds);
      Vec_IntFreeP((Vec_Int_t **)&vTop);
      return nConfPrev;
    }
    Vec_PtrClear(p_00);
    pAVar11 = Aig_ManCo(_nFramesMax_local,0);
    Vec_PtrPush(p_00,pAVar11);
    Vec_IntClear(vState);
    iVar4 = Vec_IntSize(vTopVarIds);
    pVVar3 = vTopVarIds;
    iLast = iVar4;
    iVar6 = Aig_ManRegNum(_nFramesMax_local);
    Vec_IntFillExtra(pVVar3,iVar4 + iVar6,-1);
    for (f = 0; iVar4 = Vec_PtrSize(vSupp), f < iVar4; f = f + 1) {
      pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(vSupp,f);
      iVar4 = Aig_ObjIsCi(pAVar11);
      if (iVar4 == 0) {
        __assert_fail("Aig_ObjIsCi(pObjPi)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                      ,0x109,
                      "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
      }
      iVar4 = Saig_ObjIsLo(_nFramesMax_local,pAVar11);
      if (iVar4 != 0) {
        pvVar13 = (pAVar11->field_5).pData;
        if (pvVar13 == (void *)0x0) {
          __assert_fail("pObjPiCopy != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0x10d,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        pAVar14 = Saig_ObjLoToLi(_nFramesMax_local,pAVar11);
        Vec_PtrPush(p_00,pAVar14);
        Vec_IntPush(vState,*(int *)(*(long *)(vTopVarNums + 2) +
                                   (long)*(int *)((long)pvVar13 + 0x24) * 4));
        iVar4 = (pAVar11->field_0).CioId;
        iVar6 = Saig_ManPiNum(_nFramesMax_local);
        iVar4 = iVar4 - iVar6;
        fAdded = iVar4;
        if ((iVar4 < 0) || (iVar6 = Aig_ManRegNum(_nFramesMax_local), iVar6 <= iVar4)) {
          __assert_fail("iReg >= 0 && iReg < Aig_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0x112,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        Vec_IntWriteEntry(vTopVarIds,iLast + fAdded,
                          *(int *)(*(long *)(vTopVarNums + 2) +
                                  (long)*(int *)((long)pvVar13 + 0x24) * 4));
      }
    }
    iVar4 = Vec_IntSize(vTopVarIds);
    iVar6 = Aig_ManRegNum(_nFramesMax_local);
    if (iVar4 % iVar6 != 0) {
      __assert_fail("Vec_IntSize(vState)%Aig_ManRegNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                    ,0x116,
                    "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
    }
    iVar4 = Vec_IntSize(vTopVarIds);
    iVar6 = Aig_ManRegNum(_nFramesMax_local);
    nConstrs = iVar4 / iVar6;
    if (pSat._4_4_ != 0) {
      for (f = 1; f < nConstrs + -1; f = f + 1) {
        local_b8 = local_b8 + 1;
        if (fVeryVerbose != 0) {
          printf("Adding constaint for state %2d and state %2d.\n",(ulong)(uint)f,
                 (ulong)(nConstrs - 1));
        }
        pAVar12 = pAigPart;
        pVVar3 = vTopVarIds;
        iVar4 = Aig_ManRegNum(_nFramesMax_local);
        iVar4 = Saig_ManAddUniqueness
                          ((sat_solver *)pAVar12,pVVar3,iVar4,f,nConstrs + -1,&nOldSize,
                           (int *)((long)&clk + 4),fVerbose);
        if (iVar4 != 0) break;
      }
      if (f < nConstrs + -1) {
        nConfPrev = 1;
        goto LAB_008d4620;
      }
    }
    do {
      nClauses = 0;
      iReg = (int)*(undefined8 *)&pAigPart->fCreatePios;
      uVar17 = 0;
      nSatVarNum = sat_solver_solve((sat_solver *)pAigPart,(lit *)0x0,(lit *)0x0,
                                    (long)fUniqueAll_local,0,0,0);
      iVar4 = Lits[0];
      if (fVerbose != 0) {
        uVar7 = Aig_ManCiNum((Aig_Man_t *)pCnfPart);
        uVar8 = Aig_ManCoNum((Aig_Man_t *)pCnfPart);
        uVar9 = Aig_ManNodeNum((Aig_Man_t *)pCnfPart);
        printf("Frame %4d : PI =%5d. PO =%5d. AIG =%5d. Var =%7d. Clau =%7d. Conf =%7d. ",
               (ulong)(uint)iVar4,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9,(ulong)(uint)nOldSize,
               CONCAT44(uVar17,clk._4_4_),(int)*(undefined8 *)&pAigPart->fCreatePios - iReg);
        Abc_Print(1,"%s =","Time");
        aVar15 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar15 - aVar10) * 1.0) / 1000000.0);
      }
      if (nSatVarNum == 0) goto LAB_008d4620;
      if (nSatVarNum == -1) {
        nConfPrev = 1;
        goto LAB_008d4620;
      }
      if (nSatVarNum != 1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                      ,0x13c,
                      "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
      }
      if (fVeryVerbose != 0) {
        for (f = 0; iVar4 = Vec_IntSize(vTopVarIds), f < iVar4; f = f + 1) {
          fAdded = Vec_IntEntry(vTopVarIds,f);
          if ((f != 0) && (iVar4 = Aig_ManRegNum(_nFramesMax_local), f % iVar4 == 0)) {
            printf("\n");
          }
          iVar4 = Aig_ManRegNum(_nFramesMax_local);
          if (f % iVar4 == 0) {
            iVar4 = Aig_ManRegNum(_nFramesMax_local);
            printf("       State %3d : ",(long)f / (long)iVar4 & 0xffffffff,
                   (long)f % (long)iVar4 & 0xffffffff);
          }
          if (fAdded < 0) {
            local_1d4 = 0x78;
          }
          else {
            iVar4 = sat_solver_var_value((sat_solver *)pAigPart,fAdded);
            local_1d4 = iVar4 + 0x30;
          }
          printf("%c",(ulong)local_1d4);
        }
        printf("\n");
      }
      if ((fUnique_local != 0) && (Lits[0] == fUnique_local + -1)) {
        if (nSatVarNum != 1) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0x14d,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        if (fGetCex != 0) {
          pCex._0_4_ = 0;
          iVar4 = Aig_ManRegNum(_nFramesMax_local);
          iVar6 = Saig_ManPiNum(_nFramesMax_local);
          pAVar16 = Abc_CexAlloc(iVar4 + -1,iVar6,1);
          pAVar16->iFrame = 0;
          pAVar16->iPo = 0;
          for (f = 1; iVar4 = Vec_IntSize((Vec_Int_t *)vTop), f < iVar4; f = f + 1) {
            iVar4 = Vec_IntEntry((Vec_Int_t *)vTop,f);
            if ((-1 < iVar4) &&
               (iVar4 = sat_solver_var_value((sat_solver *)pAigPart,iVar4), iVar4 != 0)) {
              Abc_InfoSetBit((uint *)(pAVar16 + 1),(int)pCex);
            }
            pCex._0_4_ = (int)pCex + 1;
          }
          if ((int)pCex != pAVar16->nBits) {
            __assert_fail("iBit == pCex->nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0x15a,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          Abc_CexFree(_nFramesMax_local->pSeqModel);
          _nFramesMax_local->pSeqModel = pAVar16;
        }
        goto LAB_008d4620;
      }
      if (local_20 != 0) {
        for (f = 1; iVar4 = f, f < nConstrs; f = f + 1) {
          do {
            do {
              pAVar12 = pAigPart;
              pVVar3 = vTopVarIds;
              Lits[1] = iVar4 + 1;
              if (nConstrs <= Lits[1]) goto LAB_008d45c6;
              iVar4 = Aig_ManRegNum(_nFramesMax_local);
              iVar6 = Saig_ManStatesAreEqual((sat_solver *)pAVar12,pVVar3,iVar4,f,Lits[1]);
              iVar4 = Lits[1];
            } while (iVar6 == 0);
            local_b8 = local_b8 + 1;
            nClauses = 1;
            if (fVeryVerbose != 0) {
              printf("Adding constaint for state %2d and state %2d.\n",(ulong)(uint)f,
                     (ulong)(uint)Lits[1]);
            }
            pAVar12 = pAigPart;
            pVVar3 = vTopVarIds;
            iVar4 = Aig_ManRegNum(_nFramesMax_local);
            iVar6 = Saig_ManAddUniqueness
                              ((sat_solver *)pAVar12,pVVar3,iVar4,f,Lits[1],&nOldSize,
                               (int *)((long)&clk + 4),fVerbose);
            iVar4 = Lits[1];
          } while (iVar6 == 0);
LAB_008d45c6:
          if (Lits[1] < nConstrs) break;
        }
        if (f < nConstrs) {
          nConfPrev = 1;
          goto LAB_008d4620;
        }
      }
    } while (nClauses != 0);
    Lits[0] = Lits[0] + 1;
  } while( true );
}

Assistant:

int Saig_ManInduction( Aig_Man_t * p, int nTimeOut, int nFramesMax, int nConfMax, int fUnique, int fUniqueAll, int fGetCex, int fVerbose, int fVeryVerbose )
{
    sat_solver * pSat;
    Aig_Man_t * pAigPart = NULL;
    Cnf_Dat_t * pCnfPart = NULL;
    Vec_Int_t * vTopVarNums, * vState, * vTopVarIds = NULL;
    Vec_Ptr_t * vTop, * vBot;
    Aig_Obj_t * pObjPi, * pObjPiCopy, * pObjPo;
    int i, k, f, Lits[2], status = -1, RetValue, nSatVarNum, nConfPrev;
    int nOldSize, iReg, iLast, fAdded, nConstrs = 0, nClauses = 0;
    abctime clk, nTimeToStop = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    assert( fUnique == 0 || fUniqueAll == 0 );
    assert( Saig_ManPoNum(p) == 1 );
    Aig_ManSetCioIds( p );

    // start the top by including the PO
    vBot = Vec_PtrAlloc( 100 );
    vTop = Vec_PtrAlloc( 100 );
    vState = Vec_IntAlloc( 1000 );
    Vec_PtrPush( vTop, Aig_ManCo(p, 0) );
    // start the array of CNF variables
    vTopVarNums = Vec_IntAlloc( 100 );
    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 1000 );

    // set runtime limit
    if ( nTimeToStop )
        sat_solver_set_runtime_limit( pSat, nTimeToStop );

    // iterate backward unrolling
    RetValue = -1;
    nSatVarNum = 0;
    if ( fVerbose )
        printf( "Induction parameters: FramesMax = %5d. ConflictMax = %6d.\n", nFramesMax, nConfMax );
    for ( f = 0; ; f++ )
    { 
        if ( f > 0 )
        {
            Aig_ManStop( pAigPart );
            Cnf_DataFree( pCnfPart );
        }
        clk = Abc_Clock();
        // get the bottom
        Aig_SupportNodes( p, (Aig_Obj_t **)Vec_PtrArray(vTop), Vec_PtrSize(vTop), vBot );
        // derive AIG for the part between top and bottom
        pAigPart = Aig_ManDupSimpleDfsPart( p, vBot, vTop );
        // convert it into CNF
        pCnfPart = Cnf_Derive( pAigPart, Aig_ManCoNum(pAigPart) );
        Cnf_DataLift( pCnfPart, nSatVarNum );
        nSatVarNum += pCnfPart->nVars;
        nClauses   += pCnfPart->nClauses;

        // remember top frame var IDs
        if ( fGetCex && vTopVarIds == NULL )
        {
            vTopVarIds = Vec_IntStartFull( Aig_ManCiNum(p) );
            Aig_ManForEachCi( p, pObjPi, i )
            {
                if ( pObjPi->pData == NULL )
                    continue;
                pObjPiCopy = (Aig_Obj_t *)pObjPi->pData;
                assert( Aig_ObjIsCi(pObjPiCopy) );
                if ( Saig_ObjIsPi(p, pObjPi) )
                    Vec_IntWriteEntry( vTopVarIds, Aig_ObjCioId(pObjPi) + Saig_ManRegNum(p), pCnfPart->pVarNums[Aig_ObjId(pObjPiCopy)] );
                else if ( Saig_ObjIsLo(p, pObjPi) )
                    Vec_IntWriteEntry( vTopVarIds, Aig_ObjCioId(pObjPi) - Saig_ManPiNum(p), pCnfPart->pVarNums[Aig_ObjId(pObjPiCopy)] );
                else assert( 0 );
            }
        }

        // stitch variables of top and bot
        assert( Aig_ManCoNum(pAigPart)-1 == Vec_IntSize(vTopVarNums) );
        Aig_ManForEachCo( pAigPart, pObjPo, i )
        {
            if ( i == 0 )
            {
                // do not perform inductive strengthening
//                if ( f > 0 )
//                    continue;
                // add topmost literal
                Lits[0] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], f>0 );
                if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
                    assert( 0 );
                nClauses++;
                continue;
            }
            Lits[0] = toLitCond( Vec_IntEntry(vTopVarNums, i-1), 0 );
            Lits[1] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], 1 );
            if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
                assert( 0 );
            Lits[0] = toLitCond( Vec_IntEntry(vTopVarNums, i-1), 1 );
            Lits[1] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], 0 );
            if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
                assert( 0 );
            nClauses += 2;
        }
        // add CNF to the SAT solver
        for ( i = 0; i < pCnfPart->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnfPart->pClauses[i], pCnfPart->pClauses[i+1] ) )
                break;
        if ( i < pCnfPart->nClauses )
        {
//            printf( "SAT solver became UNSAT after adding clauses.\n" );
            RetValue = 1;
            break;
        }

        // create new set of POs to derive new top
        Vec_PtrClear( vTop );
        Vec_PtrPush( vTop, Aig_ManCo(p, 0) );
        Vec_IntClear( vTopVarNums );
        nOldSize = Vec_IntSize(vState);
        Vec_IntFillExtra( vState, nOldSize + Aig_ManRegNum(p), -1 );
        Vec_PtrForEachEntry( Aig_Obj_t *, vBot, pObjPi, i )
        {
            assert( Aig_ObjIsCi(pObjPi) );
            if ( Saig_ObjIsLo(p, pObjPi) )
            {
                pObjPiCopy = (Aig_Obj_t *)pObjPi->pData;
                assert( pObjPiCopy != NULL );
                Vec_PtrPush( vTop, Saig_ObjLoToLi(p, pObjPi) );
                Vec_IntPush( vTopVarNums, pCnfPart->pVarNums[pObjPiCopy->Id] );

                iReg = pObjPi->CioId - Saig_ManPiNum(p);
                assert( iReg >= 0 && iReg < Aig_ManRegNum(p) );
                Vec_IntWriteEntry( vState, nOldSize+iReg, pCnfPart->pVarNums[pObjPiCopy->Id] );
            }
        } 
        assert( Vec_IntSize(vState)%Aig_ManRegNum(p) == 0 );
        iLast = Vec_IntSize(vState)/Aig_ManRegNum(p);
        if ( fUniqueAll )
        {
            for ( i = 1; i < iLast-1; i++ )
            {
                nConstrs++;
                if ( fVeryVerbose )
                    printf( "Adding constaint for state %2d and state %2d.\n", i, iLast-1 );
                if ( Saig_ManAddUniqueness( pSat, vState, Aig_ManRegNum(p), i, iLast-1, &nSatVarNum, &nClauses, fVerbose ) )
                    break;
            }
            if ( i < iLast-1 )
            {
                RetValue = 1;
                break;
            }
        }

nextrun:
        fAdded = 0;
        // run the SAT solver
        nConfPrev = pSat->stats.conflicts;
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfMax, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Frame %4d : PI =%5d. PO =%5d. AIG =%5d. Var =%7d. Clau =%7d. Conf =%7d. ",
                f, Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), Aig_ManNodeNum(pAigPart), 
                nSatVarNum, nClauses, (int)pSat->stats.conflicts-nConfPrev );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( status == l_Undef )
            break;
        if ( status == l_False )
        {
            RetValue = 1;
            break;
        }
        assert( status == l_True );
        // the problem is SAT - add more clauses
        if ( fVeryVerbose )
        {
            Vec_IntForEachEntry( vState, iReg, i )
            {
                if ( i && (i % Aig_ManRegNum(p)) == 0 )
                    printf( "\n" );
                if ( (i % Aig_ManRegNum(p)) == 0 )
                    printf( "       State %3d : ", i/Aig_ManRegNum(p) );
                printf( "%c", (iReg >= 0) ? ('0' + sat_solver_var_value(pSat, iReg)) : 'x' );
            }
            printf( "\n" );
        }
        if ( nFramesMax && f == nFramesMax - 1 )
        {
            // derive counter-example
            assert( status == l_True );
            if ( fGetCex )
            {
                int VarNum, iBit = 0;
                Abc_Cex_t * pCex = Abc_CexAlloc( Aig_ManRegNum(p)-1, Saig_ManPiNum(p), 1 );
                pCex->iFrame = 0;
                pCex->iPo = 0;
                Vec_IntForEachEntryStart( vTopVarIds, VarNum, i, 1 )
                {
                    if ( VarNum >= 0 && sat_solver_var_value( pSat, VarNum ) )
                        Abc_InfoSetBit( pCex->pData, iBit );
                    iBit++;
                }
                assert( iBit == pCex->nBits );
                Abc_CexFree( p->pSeqModel );
                p->pSeqModel = pCex;
            }
            break;
        }
        if ( fUnique )
        {
            for ( i = 1; i < iLast; i++ )
            {
                for ( k = i+1; k < iLast; k++ )
                {
                    if ( !Saig_ManStatesAreEqual( pSat, vState, Aig_ManRegNum(p), i, k ) )
                        continue;
                    nConstrs++;
                    fAdded = 1;
                    if ( fVeryVerbose )
                        printf( "Adding constaint for state %2d and state %2d.\n", i, k );
                    if ( Saig_ManAddUniqueness( pSat, vState, Aig_ManRegNum(p), i, k, &nSatVarNum, &nClauses, fVerbose ) )
                        break;
                }
                if ( k < iLast )
                    break;
            }
            if ( i < iLast )
            {
                RetValue = 1;
                break;
            }
        }
        if ( fAdded )
            goto nextrun;
    }
    if ( fVerbose )
    {
        if ( nTimeToStop && Abc_Clock() >= nTimeToStop )
            printf( "Timeout (%d sec) was reached during iteration %d.\n", nTimeOut, f+1 );
        else if ( status == l_Undef )
            printf( "Conflict limit (%d) was reached during iteration %d.\n", nConfMax, f+1 );
        else if ( fUnique || fUniqueAll )
            printf( "Completed %d iterations and added %d uniqueness constraints.\n", f+1, nConstrs );
        else
            printf( "Completed %d iterations.\n", f+1 );
    }
    // cleanup
    sat_solver_delete( pSat );
    Aig_ManStop( pAigPart );
    Cnf_DataFree( pCnfPart );
    Vec_IntFree( vTopVarNums );
    Vec_PtrFree( vTop );
    Vec_PtrFree( vBot );
    Vec_IntFree( vState );
    Vec_IntFreeP( &vTopVarIds );
    return RetValue;
}